

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_reader_init(mpack_reader_t *reader,char *buffer,size_t size,size_t count)

{
  reader->skip = (mpack_reader_skip_t)0x0;
  reader->buffer = (char *)0x0;
  reader->size = 0;
  reader->data = (char *)0x0;
  reader->end = (char *)0x0;
  *(undefined8 *)&reader->error = 0;
  reader->error_fn = (mpack_reader_error_t)0x0;
  reader->teardown = (mpack_reader_teardown_t)0x0;
  reader->context = (void *)0x0;
  reader->fill = (mpack_reader_fill_t)0x0;
  reader->buffer = buffer;
  reader->size = size;
  reader->data = buffer;
  reader->end = buffer + count;
  return;
}

Assistant:

void mpack_reader_init(mpack_reader_t* reader, char* buffer, size_t size, size_t count) {
    mpack_assert(buffer != NULL, "buffer is NULL");

    mpack_memset(reader, 0, sizeof(*reader));
    reader->buffer = buffer;
    reader->size = size;
    reader->data = buffer;
    reader->end = buffer + count;

    #if MPACK_READ_TRACKING
    mpack_reader_flag_if_error(reader, mpack_track_init(&reader->track));
    #endif

    mpack_log("===========================\n");
    mpack_log("initializing reader with buffer size %i\n", (int)size);
}